

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUnate.c
# Opt level: O2

void Abc_NtkPrintUnate(Abc_Ntk_t *pNtk,int fUseBdds,int fUseNaive,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  abctime aVar3;
  DdManager *dd;
  abctime aVar4;
  Abc_Obj_t *pAVar5;
  DdNode *pDVar6;
  Extra_UnateInfo_t *pEVar7;
  abctime aVar8;
  int level;
  uint uVar9;
  
  if (fUseBdds != 0 || fUseNaive != 0) {
    aVar3 = Abc_Clock();
    dd = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,10000000,1,1,0,fVerbose);
    if (dd != (DdManager *)0x0) {
      aVar4 = Abc_Clock();
      uVar1 = Cudd_ReadKeys(dd);
      uVar2 = Cudd_ReadDead(dd);
      printf("Shared BDD size = %6d nodes.\n",(ulong)(uVar1 - uVar2));
      if (fUseNaive == 0) {
        Cudd_zddVarsFromBddVars(dd,2);
        uVar1 = 0;
        uVar2 = 0;
        for (uVar9 = 0; (int)uVar9 < pNtk->vCos->nSize; uVar9 = uVar9 + 1) {
          pAVar5 = Abc_NtkCo(pNtk,uVar9);
          pDVar6 = (DdNode *)Abc_ObjGlobalBdd(pAVar5);
          pEVar7 = Extra_UnateComputeFast(dd,pDVar6);
          if (fVerbose != 0) {
            printf("Out%4d : ",(ulong)uVar9);
            Extra_UnateInfoPrint(pEVar7);
          }
          uVar2 = uVar2 + pEVar7->nVars;
          uVar1 = uVar1 + pEVar7->nUnate;
          Extra_UnateInfoDissolve(pEVar7);
        }
      }
      else {
        uVar1 = 0;
        uVar2 = 0;
        for (uVar9 = 0; (int)uVar9 < pNtk->vCos->nSize; uVar9 = uVar9 + 1) {
          pAVar5 = Abc_NtkCo(pNtk,uVar9);
          pDVar6 = (DdNode *)Abc_ObjGlobalBdd(pAVar5);
          pEVar7 = Extra_UnateComputeSlow(dd,pDVar6);
          if (fVerbose != 0) {
            printf("Out%4d : ",(ulong)uVar9);
            Extra_UnateInfoPrint(pEVar7);
          }
          uVar2 = uVar2 + pEVar7->nVars;
          uVar1 = uVar1 + pEVar7->nUnate;
          Extra_UnateInfoDissolve(pEVar7);
        }
      }
      aVar8 = Abc_Clock();
      level = 0x7ae620;
      printf("Ins/Outs = %4d/%4d.  Total supp = %5d.  Total unate = %5d.\n",
             (ulong)(uint)pNtk->vCis->nSize,(ulong)(uint)pNtk->vCos->nSize,(ulong)uVar2,(ulong)uVar1
            );
      Abc_Print(level,"%s =","Glob BDDs");
      Abc_Print(level,"%9.2f sec\n",(double)(aVar4 - aVar3) / 1000000.0);
      Abc_Print(level,"%s =","Unateness");
      Abc_Print(level,"%9.2f sec\n",(double)(aVar8 - aVar4) / 1000000.0);
      Abc_Print(level,"%s =","Total    ");
      aVar4 = Abc_Clock();
      Abc_Print(level,"%9.2f sec\n",(double)(aVar4 - aVar3) / 1000000.0);
      Abc_NtkFreeGlobalBdds(pNtk,1);
      return;
    }
  }
  return;
}

Assistant:

void Abc_NtkPrintUnate( Abc_Ntk_t * pNtk, int fUseBdds, int fUseNaive, int fVerbose )
{
    if ( fUseBdds || fUseNaive )
        Abc_NtkPrintUnateBdd( pNtk, fUseNaive, fVerbose );
    else
        Abc_NtkPrintUnateSat( pNtk, fVerbose );
}